

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write<std::__cxx11::string,int,int,int>
          (BasicWriter<char> *this,BasicCStringRef<char> arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          int *args_2,int *args_3)

{
  pointer local_48;
  size_type sStack_40;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  local_48 = (args->_M_dataplus)._M_p;
  sStack_40 = args->_M_string_length;
  local_38 = (ulong)(uint)*args_1;
  local_28 = (ulong)(uint)*args_2;
  local_18 = (ulong)(uint)*args_3;
  write(this,(int)arg0.data_,(void *)0x222b,(size_t)&local_48);
  return;
}

Assistant:

BasicWriter &operator<<(int value)
    {
        write_decimal(value);
        return *this;
    }